

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retCore.c
# Opt level: O3

int Abc_NtkRetime(Abc_Ntk_t *pNtk,int Mode,int nDelayLim,int fForwardOnly,int fBackwardOnly,
                 int fOneStep,int fUseOldNames,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  timespec ts;
  timespec local_48;
  int local_38;
  int local_34;
  
  local_34 = pNtk->nObjCounts[8];
  local_38 = Abc_NtkLevel(pNtk);
  clock_gettime(3,&local_48);
  if (5 < Mode - 1U) {
    __assert_fail("Mode > 0 && Mode < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retCore.c"
                  ,0x36,"int Abc_NtkRetime(Abc_Ntk_t *, int, int, int, int, int, int, int)");
  }
  if (fBackwardOnly == 0 || fForwardOnly == 0) {
    iVar2 = pNtk->nObjCounts[7];
    iVar1 = pNtk->nObjCounts[8];
    Abc_NtkCleanupSeq(pNtk,0,0,0);
    uVar4 = iVar2 - pNtk->nObjCounts[7];
    uVar3 = iVar1 - pNtk->nObjCounts[8];
    if (uVar3 != 0 && pNtk->nObjCounts[8] <= iVar1 || uVar4 != 0 && pNtk->nObjCounts[7] <= iVar2) {
      printf("Cleanup before retiming removed %d dangling nodes and %d dangling latches.\n",
             (ulong)uVar4,(ulong)uVar3);
    }
    iVar2 = (*(code *)(&DAT_009ed390 + *(int *)(&DAT_009ed390 + (ulong)(Mode - 1U) * 4)))();
    return iVar2;
  }
  __assert_fail("!fForwardOnly || !fBackwardOnly",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retCore.c"
                ,0x37,"int Abc_NtkRetime(Abc_Ntk_t *, int, int, int, int, int, int, int)");
}

Assistant:

int Abc_NtkRetime( Abc_Ntk_t * pNtk, int Mode, int nDelayLim, int fForwardOnly, int fBackwardOnly, int fOneStep, int fUseOldNames, int fVerbose )
{
    int nLatches = Abc_NtkLatchNum(pNtk);
    int nLevels  = Abc_NtkLevel(pNtk);
    int RetValue = 0;
    abctime clkTotal = Abc_Clock();
    int nNodesOld, nLatchesOld;
    assert( Mode > 0 && Mode < 7 );
    assert( !fForwardOnly || !fBackwardOnly );

    // cleanup the network
    nNodesOld   = Abc_NtkNodeNum(pNtk);
    nLatchesOld = Abc_NtkLatchNum(pNtk);
    Abc_NtkCleanupSeq(pNtk, 0, 0, 0);
    if ( nNodesOld > Abc_NtkNodeNum(pNtk) || nLatchesOld > Abc_NtkLatchNum(pNtk) )
        printf( "Cleanup before retiming removed %d dangling nodes and %d dangling latches.\n",
            nNodesOld - Abc_NtkNodeNum(pNtk), nLatchesOld - Abc_NtkLatchNum(pNtk) );

    // perform retiming
    switch ( Mode )
    {
    case 1: // forward 
        RetValue = Abc_NtkRetimeIncremental( pNtk, nDelayLim, 1, 0, 0, fUseOldNames, fVerbose );
        break;
    case 2: // backward 
        RetValue = Abc_NtkRetimeIncremental( pNtk, nDelayLim, 0, 0, 0, fUseOldNames, fVerbose );
        break;
    case 3: // min-area 
        RetValue = Abc_NtkRetimeMinArea( pNtk, fForwardOnly, fBackwardOnly, fUseOldNames, fVerbose );
        break;
    case 4: // min-delay
        if ( !fBackwardOnly )
            RetValue += Abc_NtkRetimeIncremental( pNtk, nDelayLim, 1, 1, fOneStep, fUseOldNames, fVerbose );
        if ( !fForwardOnly )
            RetValue += Abc_NtkRetimeIncremental( pNtk, nDelayLim, 0, 1, fOneStep, fUseOldNames, fVerbose );
        break;
    case 5: // min-area + min-delay
        RetValue  = Abc_NtkRetimeMinArea( pNtk, fForwardOnly, fBackwardOnly, fUseOldNames, fVerbose );
        if ( !fBackwardOnly )
            RetValue += Abc_NtkRetimeIncremental( pNtk, nDelayLim, 1, 1, 0, fUseOldNames, fVerbose );
        if ( !fForwardOnly )
            RetValue += Abc_NtkRetimeIncremental( pNtk, nDelayLim, 0, 1, 0, fUseOldNames, fVerbose );
        break;
    case 6: // Pan's algorithm
        RetValue = Abc_NtkRetimeLValue( pNtk, 500, fVerbose );
        break;
    default:
        printf( "Unknown retiming option.\n" );
        break;
    }
    if ( fVerbose )
    {
        printf( "Reduction in area = %3d. Reduction in delay = %3d. ", 
            nLatches - Abc_NtkLatchNum(pNtk), nLevels - Abc_NtkLevel(pNtk) );
        ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    }
    timeRetime = Abc_Clock() - clkTotal;
    return RetValue;
}